

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O2

void decode_fglrx_ioctl_64(fglrx_ioctl_64 *d,mmt_memory_dump *args,int argc)

{
  uint uVar1;
  int iVar2;
  mmt_buf *buf;
  
  if (d->ptr1 == 0) {
    iVar2 = _fglrx_field_enabled("ptr1");
    if (iVar2 == 0) goto LAB_0024afbf;
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr1: %s",fglrx_pfx,"NULL");
  }
  else {
    fprintf(_stdout,"%sptr1: 0x%016lx",fglrx_pfx);
    if (0 < argc) {
      buf = find_ptr(d->ptr1,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024afc2;
    }
    fputs(" [no data]",_stdout);
LAB_0024afbf:
    buf = (mmt_buf *)0x0;
  }
LAB_0024afc2:
  fglrx_pfx = ", ";
  uVar1 = d->unk08;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk08");
    if (iVar2 != 0) goto LAB_0024afe7;
  }
  else {
LAB_0024afe7:
    fprintf(_stdout,"%sunk08: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk0c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk0c");
    if (iVar2 == 0) goto LAB_0024b047;
  }
  fprintf(_stdout,"%sunk0c: 0x%08x",", ",(ulong)uVar1);
LAB_0024b047:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(buf,"ptr1[]:");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_64(struct fglrx_ioctl_64 *d, struct mmt_memory_dump *args, int argc)
{
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
}